

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpndrv.h
# Opt level: O0

void __thiscall
CTcSymFuncBase::CTcSymFuncBase
          (CTcSymFuncBase *this,char *str,size_t len,int copy,int argc,int opt_argc,int varargs,
          int has_retval,int is_multimethod,int is_multimethod_base,int is_extern,int has_proto)

{
  CPrsArrayList *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  byte in_stack_00000008;
  byte in_stack_00000010;
  byte in_stack_00000018;
  byte in_stack_00000020;
  tc_symtype_t in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc8;
  CTcSymbol *in_stack_ffffffffffffffd0;
  
  CTcSymbol::CTcSymbol
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(size_t)in_RDI,
             in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  (in_RDI->super_CArrayList)._vptr_CArrayList = (_func_int **)&PTR__CTcSymFuncBase_003d2268;
  CPrsArrayList::CPrsArrayList(in_RDI);
  *(undefined4 *)&in_RDI[1].super_CArrayList.cnt_ = in_R8D;
  *(undefined4 *)((long)&in_RDI[1].super_CArrayList.cnt_ + 4) = in_R9D;
  *(byte *)&in_RDI[3].super_CArrayList.arr_ =
       *(byte *)&in_RDI[3].super_CArrayList.arr_ & 0xfe | in_stack_00000008 & 1;
  *(byte *)&in_RDI[3].super_CArrayList.arr_ =
       *(byte *)&in_RDI[3].super_CArrayList.arr_ & 0xfd | (in_stack_00000010 & 1) << 1;
  *(byte *)&in_RDI[3].super_CArrayList.arr_ =
       *(byte *)&in_RDI[3].super_CArrayList.arr_ & 0xef | (in_stack_00000018 & 1) << 4;
  *(byte *)&in_RDI[3].super_CArrayList.arr_ =
       *(byte *)&in_RDI[3].super_CArrayList.arr_ & 0xdf | (in_stack_00000020 & 1) << 5;
  *(byte *)&in_RDI[3].super_CArrayList.arr_ =
       *(byte *)&in_RDI[3].super_CArrayList.arr_ & 0xfb | ((byte)argc & 1) << 2;
  *(byte *)&in_RDI[3].super_CArrayList.arr_ =
       *(byte *)&in_RDI[3].super_CArrayList.arr_ & 0x7f | (char)len << 7;
  in_RDI[1].super_CArrayList.arr_ = (array_list_ele_t *)0x0;
  in_RDI[1].super_CArrayList._vptr_CArrayList = (_func_int **)0x0;
  *(byte *)&in_RDI[3].super_CArrayList.arr_ = *(byte *)&in_RDI[3].super_CArrayList.arr_ & 0xf7;
  in_RDI[1].super_CArrayList.alloc_ = 0;
  in_RDI[1].super_CArrayList.inc_siz_ = 0;
  in_RDI[2].super_CArrayList._vptr_CArrayList = (_func_int **)0x0;
  *(byte *)&in_RDI[3].super_CArrayList.arr_ = *(byte *)&in_RDI[3].super_CArrayList.arr_ & 0xbf;
  return;
}

Assistant:

CTcSymFuncBase(const char *str, size_t len, int copy,
                   int argc, int opt_argc, int varargs, int has_retval,
                   int is_multimethod, int is_multimethod_base,
                   int is_extern, int has_proto)
        : CTcSymbol(str, len, copy, TC_SYM_FUNC)
    {
        /* remember the interface information */
        argc_ = argc;
        opt_argc_ = opt_argc;
        varargs_ = varargs;
        has_retval_ = has_retval;
        is_multimethod_ = is_multimethod;
        is_multimethod_base_ = is_multimethod_base;

        /* note whether it's external */
        is_extern_ = is_extern;

        /* note whether it has a prototype */
        has_proto_ = has_proto;

        /* no code stream anchor yet */
        anchor_ = 0;

        /* no fixups yet */
        fixups_ = 0;

        /* this isn't replacing an external function */
        ext_replace_ = FALSE;

        /* we don't know our code body yet */
        code_body_ = 0;

        /* there's no base modified symbol */
        mod_base_ = 0;

        /* we haven't been modified yet */
        mod_global_ = 0;

        /* assume it's not defined in this file */
        mm_def_ = FALSE;
    }